

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Swap.cpp
# Opt level: O2

void __thiscall
OpenMD::RNEMD::SwapMethod::SwapMethod(SwapMethod *this,SimInfo *info,ForceManager *forceMan)

{
  bool bVar1;
  bool bVar2;
  RNEMDFluxType RVar3;
  RNEMDParameters *pRVar4;
  double dVar5;
  allocator_type local_51;
  vector<double,_std::allocator<double>_> momentumFluxVector;
  
  RNEMD::RNEMD(&this->super_RNEMD,info,forceMan);
  (this->super_RNEMD)._vptr_RNEMD = (_func_int **)&PTR__RNEMD_002c1a98;
  std::__cxx11::string::assign((char *)&(this->super_RNEMD).rnemdMethodLabel_);
  pRVar4 = info->simParams_->rnemdPars_;
  bVar1 = (pRVar4->KineticFlux).super_ParameterBase.empty_;
  bVar2 = (pRVar4->MomentumFlux).super_ParameterBase.empty_;
  RVar3 = (this->super_RNEMD).rnemdFluxType_;
  if (RVar3 - rnemdPx < 3) {
    if (bVar2 != false) goto LAB_001f3d7d;
LAB_001f3dad:
    dVar5 = 0.0;
    if (bVar1 == false) goto LAB_001f3db5;
  }
  else {
    if (RVar3 != rnemdKE) {
      snprintf(painCave.errMsg,2000,
               "RNEMD: The current method,\n\t\tSwap\n\tcannot be used with the current flux type, %s\n"
               ,(this->super_RNEMD).rnemdFluxTypeLabel_._M_dataplus._M_p);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
LAB_001f3d7d:
      snprintf(painCave.errMsg,2000,
               "RNEMD: The current method, Swap, and flux type, %s,\n\tdid not have the correct flux value specified. Options\n\tinclude: kineticFlux and momentumFlux.\n"
               ,(this->super_RNEMD).rnemdFluxTypeLabel_._M_dataplus._M_p);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
      goto LAB_001f3dad;
    }
    if (bVar1 != false) goto LAB_001f3d7d;
LAB_001f3db5:
    dVar5 = (pRVar4->KineticFlux).data_;
  }
  RNEMD::setKineticFlux(&this->super_RNEMD,dVar5);
  if (bVar2 != false) {
    return;
  }
  dVar5 = (pRVar4->MomentumFlux).data_;
  std::vector<double,_std::allocator<double>_>::vector(&momentumFluxVector,3,&local_51);
  RVar3 = (this->super_RNEMD).rnemdFluxType_;
  if (RVar3 != rnemdPx) {
    if (RVar3 == rnemdPy) {
      momentumFluxVector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           momentumFluxVector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
    else {
      if (RVar3 != rnemdPz) goto LAB_001f3e26;
      momentumFluxVector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           momentumFluxVector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + 2;
    }
  }
  *momentumFluxVector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
   super__Vector_impl_data._M_start = dVar5;
LAB_001f3e26:
  RNEMD::setMomentumFluxVector(&this->super_RNEMD,&momentumFluxVector);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&momentumFluxVector.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

SwapMethod::SwapMethod(SimInfo* info, ForceManager* forceMan) :
      RNEMD {info, forceMan} {
    rnemdMethodLabel_ = "Swap";

    RNEMDParameters* rnemdParams = info->getSimParams()->getRNEMDParameters();

    bool hasKineticFlux  = rnemdParams->haveKineticFlux();
    bool hasMomentumFlux = rnemdParams->haveMomentumFlux();

    bool methodFluxMismatch = false;
    bool hasCorrectFlux     = false;

    switch (rnemdFluxType_) {
    case rnemdKE:
      hasCorrectFlux = hasKineticFlux;
      break;
    case rnemdPx:
    case rnemdPy:
    case rnemdPz:
      hasCorrectFlux = hasMomentumFlux;
      break;
    default:
      methodFluxMismatch = true;
      break;
    }

    if (methodFluxMismatch) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: The current method,\n"
               "\t\tSwap\n"
               "\tcannot be used with the current flux type, %s\n",
               rnemdFluxTypeLabel_.c_str());
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (!hasCorrectFlux) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: The current method, Swap, and flux type, %s,\n"
               "\tdid not have the correct flux value specified. Options\n"
               "\tinclude: kineticFlux and momentumFlux.\n",
               rnemdFluxTypeLabel_.c_str());
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (hasKineticFlux) {
      setKineticFlux(rnemdParams->getKineticFlux());
    } else {
      setKineticFlux(0.0);
    }

    if (hasMomentumFlux) {
      RealType momentumFlux = rnemdParams->getMomentumFlux();
      std::vector<RealType> momentumFluxVector(3);

      switch (rnemdFluxType_) {
      case rnemdPx:
        momentumFluxVector[0] = momentumFlux;
        break;
      case rnemdPy:
        momentumFluxVector[1] = momentumFlux;
        break;
      case rnemdPz:
        momentumFluxVector[2] = momentumFlux;
        break;
      default:
        break;
      }

      setMomentumFluxVector(momentumFluxVector);
    }
  }